

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O3

void gdImageFlipVertical(gdImagePtr im)

{
  byte bVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  iVar5 = im->sy;
  if (im->trueColor == 0) {
    if (1 < iVar5) {
      uVar7 = (ulong)(uint)im->sx;
      lVar6 = 0;
      do {
        if (0 < (int)uVar7) {
          ppiVar2 = im->tpixels;
          piVar3 = ppiVar2[lVar6];
          lVar8 = 0;
          do {
            bVar1 = *(byte *)(piVar3 + lVar8);
            piVar3[lVar8] = ppiVar2[(int)(im->sy + ~(uint)lVar6)][lVar8];
            ppiVar2[(int)(im->sy + ~(uint)lVar6)][lVar8] = (uint)bVar1;
            lVar8 = lVar8 + 1;
            uVar7 = (ulong)im->sx;
          } while (lVar8 < (long)uVar7);
          iVar5 = im->sy;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5 / 2);
    }
  }
  else if (1 < iVar5) {
    ppiVar2 = im->tpixels;
    uVar7 = (ulong)(uint)im->sx;
    lVar6 = 0;
    do {
      if (0 < (int)uVar7) {
        piVar3 = ppiVar2[lVar6];
        piVar4 = ppiVar2[(int)(iVar5 + ~(uint)lVar6)];
        lVar8 = 0;
        do {
          iVar5 = piVar3[lVar8];
          piVar3[lVar8] = ppiVar2[(int)(im->sy + ~(uint)lVar6)][lVar8];
          piVar4[lVar8] = iVar5;
          lVar8 = lVar8 + 1;
          uVar7 = (ulong)im->sx;
        } while (lVar8 < (long)uVar7);
        iVar5 = im->sy;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5 / 2);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->tpixels[y][x];
				im->tpixels[y][x] =	im->tpixels[im->sy - 1 - y][x];
				im->tpixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}